

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitview.c
# Opt level: O2

void drawGrid(float scale,int steps)

{
  int iVar1;
  undefined4 in_register_0000003c;
  bool bVar2;
  float fVar3;
  vec3 center;
  mat4x4 view;
  
  glPushMatrix(CONCAT44(in_register_0000003c,steps));
  glClearColor(0x3d4ccccd,0x3d4ccccd,0x3e4ccccd,0);
  glClear(0x4000);
  center[2] = 0.0;
  center[0] = 0.0;
  center[1] = 0.0;
  mat4x4_look_at(view,(float *)&DAT_0010f17c,center,(float *)&DAT_0010f188);
  glLoadMatrixf(view);
  glDepthMask(0);
  glColor3f(0,0x3f000000,0x3f000000);
  glBegin(1);
  fVar3 = -2.75;
  iVar1 = 0xc;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    glVertex3f(0xc0300000,fVar3,0);
    glVertex3f(0x40300000,fVar3);
    fVar3 = fVar3 + 0.5;
  }
  fVar3 = -2.75;
  iVar1 = 0xc;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    glVertex3f(fVar3,0xc0300000,0);
    glVertex3f(fVar3,0x40300000);
    fVar3 = fVar3 + 0.5;
  }
  glEnd();
  glDepthMask(1);
  glPopMatrix();
  return;
}

Assistant:

static void drawGrid(float scale, int steps)
{
    int i;
    float x, y;
    mat4x4 view;

    glPushMatrix();

    // Set background to some dark bluish grey
    glClearColor(0.05f, 0.05f, 0.2f, 0.0f);
    glClear(GL_COLOR_BUFFER_BIT);

    // Setup modelview matrix (flat XY view)
    {
        vec3 eye = { 0.f, 0.f, 1.f };
        vec3 center = { 0.f, 0.f, 0.f };
        vec3 up = { 0.f, 1.f, 0.f };
        mat4x4_look_at(view, eye, center, up);
    }
    glLoadMatrixf((const GLfloat*) view);

    // We don't want to update the Z-buffer
    glDepthMask(GL_FALSE);

    // Set grid color
    glColor3f(0.0f, 0.5f, 0.5f);

    glBegin(GL_LINES);

    // Horizontal lines
    x = scale * 0.5f * (float) (steps - 1);
    y = -scale * 0.5f * (float) (steps - 1);
    for (i = 0;  i < steps;  i++)
    {
        glVertex3f(-x, y, 0.0f);
        glVertex3f(x, y, 0.0f);
        y += scale;
    }

    // Vertical lines
    x = -scale * 0.5f * (float) (steps - 1);
    y = scale * 0.5f * (float) (steps - 1);
    for (i = 0;  i < steps;  i++)
    {
        glVertex3f(x, -y, 0.0f);
        glVertex3f(x, y, 0.0f);
        x += scale;
    }

    glEnd();

    // Enable Z-buffer writing again
    glDepthMask(GL_TRUE);

    glPopMatrix();
}